

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

tuple<long,_long> calcSum<stSampleMulti<short,4>>(TWaveformViewT<TSampleMI16> *waveform)

{
  short sVar1;
  _Head_base<0UL,_long,_false> _Var2;
  long *in_RSI;
  long lVar3;
  stSampleMulti<short,_4> *psVar4;
  long lVar5;
  int j;
  long lVar6;
  tuple<long,_long> tVar7;
  
  if (in_RSI[1] < 1) {
    _Var2._M_head_impl = 0;
    psVar4 = (stSampleMulti<short,_4> *)0x0;
  }
  else {
    lVar3 = *in_RSI;
    lVar5 = 0;
    psVar4 = (stSampleMulti<short,_4> *)0x0;
    _Var2._M_head_impl = 0;
    do {
      lVar6 = 0;
      do {
        sVar1 = *(short *)(lVar3 + lVar6 * 2);
        _Var2._M_head_impl = _Var2._M_head_impl + sVar1;
        psVar4 = (stSampleMulti<short,_4> *)
                 ((long)(psVar4->super_array<short,_4UL>)._M_elems +
                 (ulong)(uint)((int)sVar1 * (int)sVar1));
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar5 != in_RSI[1]);
  }
  waveform->samples = psVar4;
  waveform->n = _Var2._M_head_impl;
  tVar7.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       _Var2._M_head_impl;
  tVar7.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform;
  return (tuple<long,_long>)tVar7.super__Tuple_impl<0UL,_long,_long>;
}

Assistant:

std::tuple<int64_t, int64_t> calcSum(const TWaveformViewT<TSampleMI16> & waveform) {
    int64_t sum = 0;
    int64_t sum2 = 0;

    auto samples = waveform.samples;
    auto n       = waveform.n;

    for (int is = 0; is < n; ++is) {
        for (int j = 0; j < TSampleMI16::N; j++) {
            int32_t a0 = samples[is][j];
            sum += a0;
            sum2 += a0*a0;
        }
    }

    return std::tuple<int64_t, int64_t>(sum, sum2);
}